

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseArray(Parser *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar7;
  shared_ptr<minja::Expression> expr;
  shared_ptr<minja::Expression> first_expr;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  elements;
  shared_ptr<minja::ArrayExpr> *in_stack_fffffffffffffdb8;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_fffffffffffffdc0;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  Location *in_stack_fffffffffffffde8;
  Location *__args;
  allocator<char> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffffe08;
  SpaceHandling in_stack_fffffffffffffe5c;
  string *in_stack_fffffffffffffe60;
  Parser *in_stack_fffffffffffffe68;
  string local_180 [7];
  undefined1 in_stack_fffffffffffffe87;
  Parser *in_stack_fffffffffffffe88;
  __shared_ptr local_160 [23];
  undefined1 local_149 [33];
  string local_128 [32];
  __shared_ptr local_108 [20];
  undefined4 local_f4;
  undefined1 local_c1 [33];
  string local_a0 [79];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,
             (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0);
  consumeToken(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((bVar1 & 1) == 0) {
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::vector((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
              *)0x2f3b3a);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0);
    consumeToken(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
    if ((bVar2 & 1) == 0) {
      parseExpression(in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
      bVar3 = std::__shared_ptr::operator_cast_to_bool(local_108);
      if (!bVar3) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected first expression in array");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ::push_back(in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffdc0,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffdb8);
        if (!bVar3) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected closing bracket");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __args = (Location *)local_149;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffdf8),
                   in_stack_fffffffffffffdf0);
        consumeToken(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        bVar4 = std::__cxx11::string::empty();
        bVar4 = bVar4 ^ 0xff;
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string((string *)(local_149 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_149);
        if ((bVar4 & 1) == 0) break;
        parseExpression(in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffe87);
        bVar3 = std::__shared_ptr::operator_cast_to_bool(local_160);
        if (!bVar3) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Expected expression in array");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
        ::push_back(in_stack_fffffffffffffdc0,(value_type *)in_stack_fffffffffffffdb8);
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f3f49);
      }
      in_stack_fffffffffffffdd0 =
           (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            *)&stack0xfffffffffffffe5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(bVar2,in_stack_fffffffffffffdf8),in_stack_fffffffffffffdf0
                );
      consumeToken(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe5f);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected comma or closing bracket in array");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      get_location((Parser *)CONCAT17(bVar1,in_stack_fffffffffffffe08));
      std::
      make_shared<minja::ArrayExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
                (__args,(vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                         *)CONCAT17(bVar4,in_stack_fffffffffffffde0));
      std::shared_ptr<minja::Expression>::shared_ptr<minja::ArrayExpr,void>
                ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
      std::shared_ptr<minja::ArrayExpr>::~shared_ptr((shared_ptr<minja::ArrayExpr> *)0x2f4041);
      Location::~Location((Location *)0x2f404b);
      local_f4 = 1;
      std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f4063);
    }
    else {
      get_location((Parser *)CONCAT17(bVar1,in_stack_fffffffffffffe08));
      std::
      make_shared<minja::ArrayExpr,minja::Location,std::vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>>
                (in_stack_fffffffffffffde8,
                 (vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                  *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      std::shared_ptr<minja::Expression>::shared_ptr<minja::ArrayExpr,void>
                ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
      std::shared_ptr<minja::ArrayExpr>::~shared_ptr((shared_ptr<minja::ArrayExpr> *)0x2f3c21);
      Location::~Location((Location *)0x2f3c2e);
      local_f4 = 1;
    }
    std::
    vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
    ::~vector(in_stack_fffffffffffffdd0);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<minja::Expression>::shared_ptr
              ((shared_ptr<minja::Expression> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
    ;
    _Var6._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<minja::Expression>)
         sVar7.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseArray() {
        if (consumeToken("[").empty()) return nullptr;

        std::vector<std::shared_ptr<Expression>> elements;
        if (!consumeToken("]").empty()) {
            return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
        }
        auto first_expr = parseExpression();
        if (!first_expr) throw std::runtime_error("Expected first expression in array");
        elements.push_back(std::move(first_expr));

        while (it != end) {
            if (!consumeToken(",").empty()) {
              auto expr = parseExpression();
              if (!expr) throw std::runtime_error("Expected expression in array");
              elements.push_back(std::move(expr));
            } else if (!consumeToken("]").empty()) {
                return std::make_shared<ArrayExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing bracket in array");
            }
        }
        throw std::runtime_error("Expected closing bracket");
    }